

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseExtGNU_ChooseExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  ExtGNU_ChooseExpressionSyntax *pEVar3;
  IndexType IVar4;
  ostream *poVar5;
  allocator<char> local_39;
  string local_38;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == Keyword_ExtGNU___builtin_choose_expr) {
    this_00 = SyntaxTree::parseOptions(this->tree_);
    this_01 = ParseOptions::languageExtensions(this_00);
    bVar1 = LanguageExtensions::isEnabled_extGNU_InternalBuiltins(this_01);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"GNU internal builtins",&local_39);
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    pEVar3 = makeNode<psy::C::ExtGNU_ChooseExpressionSyntax>(this);
    *expr = &pEVar3->super_ExpressionSyntax;
    IVar4 = consume(this);
    pEVar3->kwTkIdx_ = IVar4;
    bVar1 = match(this,OpenParenToken,&pEVar3->openParenTkIdx_);
    if ((((bVar1) &&
         (bVar1 = parseConstant<psy::C::ConstantExpressionSyntax>
                            (this,&pEVar3->constExpr_,IntegerConstantExpression), bVar1)) &&
        (bVar1 = match(this,CommaToken,&pEVar3->commaTkIdx1_), bVar1)) &&
       (((bVar1 = parseExpressionWithPrecedenceAssignment(this,&pEVar3->expr1_), bVar1 &&
         (bVar1 = match(this,CommaToken,&pEVar3->commaTkIdx2_), bVar1)) &&
        (bVar1 = parseExpressionWithPrecedenceAssignment(this,&pEVar3->expr2_), bVar1)))) {
      bVar1 = match(this,CloseParenToken,&pEVar3->closeParenTkIdx_);
      return bVar1;
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x30b);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,"assert failure: `__builtin_choose_expr\'");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return false;
}

Assistant:

bool Parser::parseExtGNU_ChooseExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___builtin_choose_expr,
                  return false,
                  "assert failure: `__builtin_choose_expr'");

    if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_InternalBuiltins())
        diagReporter_.ExpectedFeature("GNU internal builtins");

    auto chooseExpr = makeNode<ExtGNU_ChooseExpressionSyntax>();
    expr = chooseExpr;
    chooseExpr->kwTkIdx_ = consume();
    return match(SyntaxKind::OpenParenToken, &chooseExpr->openParenTkIdx_)
        && parseConstant<ConstantExpressionSyntax>(chooseExpr->constExpr_, SyntaxKind::IntegerConstantExpression)
        && match(SyntaxKind::CommaToken, &chooseExpr->commaTkIdx1_)
        && parseExpressionWithPrecedenceAssignment(chooseExpr->expr1_)
        && match(SyntaxKind::CommaToken, &chooseExpr->commaTkIdx2_)
        && parseExpressionWithPrecedenceAssignment(chooseExpr->expr2_)
        && match(SyntaxKind::CloseParenToken, &chooseExpr->closeParenTkIdx_);
}